

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ManAssignAdjacency(Iso_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj_00;
  Iso_Obj_t *pIVar7;
  Iso_Obj_t *pIVar8;
  int local_3c;
  int i;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Iso_Obj_t *pIsoF;
  Iso_Obj_t *pIso;
  int fUseXor;
  Iso_Man_t *p_local;
  
  for (local_3c = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), local_3c < iVar2; local_3c = local_3c + 1)
  {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_3c);
    if (pAVar6 != (Aig_Obj_t *)0x0) {
      pIVar7 = p->pObjs;
      pIVar7[local_3c].FaninSig = 0;
      pIVar7[local_3c].FanoutSig = 0;
      iVar2 = Aig_ObjIsCo(pAVar6);
      if ((iVar2 == 0) && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)) {
        pIVar8 = p->pObjs;
        iVar2 = Aig_ObjFaninId0(pAVar6);
        pIVar7[local_3c].FaninSig = pIVar8[iVar2].FaninSig + pIVar7[local_3c].FaninSig;
        if (pIVar8[iVar2].Id != 0) {
          iVar1 = pIVar8[iVar2].Id;
          iVar2 = pIVar8[iVar2].Id;
          iVar4 = Aig_ObjFaninC0(pAVar6);
          uVar5 = Abc_Var2Lit(iVar2,iVar4);
          pIVar7[local_3c].FaninSig =
               iVar1 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar7[local_3c].FaninSig;
        }
        pIVar8 = p->pObjs;
        iVar2 = Aig_ObjFaninId1(pAVar6);
        pIVar7[local_3c].FaninSig = pIVar8[iVar2].FaninSig + pIVar7[local_3c].FaninSig;
        if (pIVar8[iVar2].Id != 0) {
          iVar1 = pIVar8[iVar2].Id;
          iVar2 = pIVar8[iVar2].Id;
          iVar4 = Aig_ObjFaninC1(pAVar6);
          uVar5 = Abc_Var2Lit(iVar2,iVar4);
          pIVar7[local_3c].FaninSig =
               iVar1 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar7[local_3c].FaninSig;
        }
      }
    }
  }
  local_3c = Vec_PtrSize(p->pAig->vObjs);
  while( true ) {
    do {
      local_3c = local_3c + -1;
      if (local_3c < 0) {
        local_3c = 0;
        do {
          iVar2 = Aig_ManRegNum(p->pAig);
          if (iVar2 <= local_3c) {
            return;
          }
          pAVar6 = Aig_ManLi(p->pAig,local_3c);
          pObj_00 = Aig_ManLo(p->pAig,local_3c);
          iVar2 = Aig_ObjFaninId0(pAVar6);
          if (iVar2 != 0) {
            iVar2 = Aig_ObjId(pObj_00);
            pIVar7 = Iso_ManObj(p,iVar2);
            iVar2 = Aig_ObjFaninId0(pAVar6);
            pIVar8 = Iso_ManObj(p,iVar2);
            if (pIVar7->FaninSig != 0) {
              __assert_fail("pIso->FaninSig == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                            ,0x34d,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
            }
            pIVar7->FaninSig = pIVar8->FaninSig;
            if (pIVar8->Id != 0) {
              iVar2 = pIVar8->Id;
              iVar1 = pIVar8->Id;
              iVar4 = Aig_ObjFaninC0(pAVar6);
              uVar5 = Abc_Var2Lit(iVar1,iVar4);
              pIVar7->FaninSig = iVar2 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar7->FaninSig;
            }
            pIVar8->FanoutSig = pIVar7->FanoutSig + pIVar8->FanoutSig;
            if (pIVar7->Id != 0) {
              iVar2 = pIVar7->Id;
              iVar1 = pIVar7->Id;
              iVar4 = Aig_ObjFaninC0(pAVar6);
              uVar5 = Abc_Var2Lit(iVar1,iVar4);
              pIVar8->FanoutSig = iVar2 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar8->FanoutSig;
            }
          }
          local_3c = local_3c + 1;
        } while( true );
      }
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_3c);
    } while (((pAVar6 == (Aig_Obj_t *)0x0) || (iVar2 = Aig_ObjIsCi(pAVar6), iVar2 != 0)) ||
            (iVar2 = Aig_ObjIsConst1(pAVar6), iVar2 != 0));
    pIVar7 = p->pObjs;
    iVar2 = Aig_ObjIsCo(pAVar6);
    if ((iVar2 != 0) && (pIVar7[local_3c].Id != 0)) break;
    iVar2 = Aig_ObjIsNode(pAVar6);
    if (iVar2 == 0) {
      iVar2 = Aig_ObjIsCo(pAVar6);
      if (iVar2 != 0) {
        pIVar8 = p->pObjs;
        iVar2 = Aig_ObjFaninId0(pAVar6);
        pIVar8[iVar2].FanoutSig = pIVar7[local_3c].FanoutSig + pIVar8[iVar2].FanoutSig;
        if (pIVar7[local_3c].Id != 0) {
          iVar1 = pIVar7[local_3c].Id;
          iVar4 = pIVar7[local_3c].Id;
          iVar3 = Aig_ObjFaninC0(pAVar6);
          uVar5 = Abc_Var2Lit(iVar4,iVar3);
          pIVar8[iVar2].FanoutSig =
               iVar1 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar8[iVar2].FanoutSig;
        }
      }
    }
    else {
      pIVar8 = p->pObjs;
      iVar2 = Aig_ObjFaninId0(pAVar6);
      pIVar8[iVar2].FanoutSig = pIVar7[local_3c].FanoutSig + pIVar8[iVar2].FanoutSig;
      if (pIVar7[local_3c].Id != 0) {
        iVar1 = pIVar7[local_3c].Id;
        iVar4 = pIVar7[local_3c].Id;
        iVar3 = Aig_ObjFaninC0(pAVar6);
        uVar5 = Abc_Var2Lit(iVar4,iVar3);
        pIVar8[iVar2].FanoutSig = iVar1 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar8[iVar2].FanoutSig
        ;
      }
      pIVar8 = p->pObjs;
      iVar2 = Aig_ObjFaninId1(pAVar6);
      pIVar8[iVar2].FanoutSig = pIVar7[local_3c].FanoutSig + pIVar8[iVar2].FanoutSig;
      if (pIVar7[local_3c].Id != 0) {
        iVar1 = pIVar7[local_3c].Id;
        iVar4 = pIVar7[local_3c].Id;
        iVar3 = Aig_ObjFaninC1(pAVar6);
        uVar5 = Abc_Var2Lit(iVar4,iVar3);
        pIVar8[iVar2].FanoutSig = iVar1 * s_1kPrimes[(int)(uVar5 & 0x3ff)] + pIVar8[iVar2].FanoutSig
        ;
      }
    }
  }
  __assert_fail("!Aig_ObjIsCo(pObj) || pIso->Id == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x317,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
}

Assistant:

void Iso_ManAssignAdjacency( Iso_Man_t * p )
{
    int fUseXor = 0;
    Iso_Obj_t * pIso, * pIsoF;
    Aig_Obj_t * pObj, * pObjLi;
    int i;

    // create TFI signatures
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        pIso = p->pObjs + i;
        pIso->FaninSig = 0;
        pIso->FanoutSig = 0;

        if ( Aig_ObjIsCo(pObj) )
            continue;
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
    }
    // create TFO signatures
    Aig_ManForEachObjReverse( p->pAig, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
            continue;
        pIso = p->pObjs + i;
        assert( !Aig_ObjIsCo(pObj) || pIso->Id == 0 );
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
    }

    // consider flops
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObj, i )
    {
        if ( Aig_ObjFaninId0(pObjLi) == 0 ) // ignore constant!
            continue;
        pIso  = Iso_ManObj( p, Aig_ObjId(pObj) );
        pIsoF = Iso_ManObj( p, Aig_ObjFaninId0(pObjLi) );
        assert( pIso->FaninSig == 0 );
//        assert( pIsoF->FanoutSig == 0 );

        if ( fUseXor )
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
        else
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
    }
}